

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O2

bool xercesc_4_0::XMLChar1_1::isValidName(XMLCh *toCheck)

{
  XMLCh XVar1;
  bool bVar2;
  bool bVar3;
  XMLCh *pXVar4;
  bool bVar5;
  
  if ((ushort)(*toCheck + L'⠀') < 0x380) {
    if ((ushort)(toCheck[1] + L'\x2000') < 0xfc00) {
      return false;
    }
    pXVar4 = toCheck + 2;
  }
  else {
    if (((&fgCharCharsTable1_1)[(ushort)*toCheck] & 2) == 0) {
      return false;
    }
    pXVar4 = toCheck + 1;
  }
  bVar2 = false;
  do {
    while( true ) {
      while( true ) {
        XVar1 = *pXVar4;
        bVar5 = (ulong)(ushort)XVar1 == 0;
        if (bVar5) {
          return bVar5;
        }
        pXVar4 = pXVar4 + 1;
        if ((XVar1 & 0xfc00U) != 0xdc00) break;
        bVar3 = !bVar2;
        bVar2 = false;
        if (bVar3) {
          return bVar5;
        }
      }
      if ((XVar1 & 0xfc00U) != 0xd800) break;
      bVar3 = (bool)(0xdb7f < (ushort)XVar1 | bVar2);
      bVar2 = true;
      if (bVar3) {
        return bVar5;
      }
    }
    if (bVar2) {
      return bVar5;
    }
    bVar2 = false;
  } while (((&fgCharCharsTable1_1)[(ushort)XVar1] & 4) != 0);
  return bVar5;
}

Assistant:

bool XMLChar1_1::isValidName(const   XMLCh* const    toCheck)
{
    const XMLCh* curCh = toCheck;

    XMLCh nextCh = *curCh++;
    if ((nextCh >= 0xD800) && (nextCh <= 0xDB7F))
	{
        nextCh = *curCh++;
        if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
		{
            return false;
		}
    }
    else if (!(fgCharCharsTable1_1[nextCh] & gFirstNameCharMask))
	{
            return false;
	}

    bool    gotLeadingSurrogate = false;

    while (*curCh != 0)
    {
        nextCh = *curCh++;

        // Deal with surrogate pairs
        if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
        {
            //  It's a leading surrogate. If we already got one, then
            //  issue an error, else set leading flag to make sure that
            //  we look for a trailing next time.
            if (nextCh > 0xDB7F || gotLeadingSurrogate)
            {
                return false;
            }
            else
			{
                gotLeadingSurrogate = true;
			}
        }
        else
        {
            //  If it's a trailing surrogate, make sure that we are
            //  prepared for that. Else, it's just a regular char so make
            //  sure that we were not expected a trailing surrogate.
           if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
           {
                // It's trailing, so make sure we were expecting it
                if (!gotLeadingSurrogate)
                    return false;
            }
            else
            {
                //  It's just a char, so make sure we were not expecting a
                //  trailing surrogate.
                if (gotLeadingSurrogate)
				{
                    return false;
                }
                // It's got to at least be a valid XML character
                else if (!(fgCharCharsTable1_1[nextCh] & gNameCharMask))
                {
                    return false;
                }
            }
           gotLeadingSurrogate = false;
        }
    }
    return true;
}